

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectFile.cpp
# Opt level: O3

string * __thiscall
ObjectFile::getFilename_abi_cxx11_(string *__return_storage_ptr__,ObjectFile *this)

{
  string *psVar1;
  pointer pcVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  
  psVar1 = &this->path;
  lVar3 = std::__cxx11::string::find_last_of((char *)psVar1,0x17325c,0xffffffffffffffff);
  if (lVar3 == -1) {
    uVar5 = (this->path)._M_string_length;
  }
  else {
    uVar4 = std::__cxx11::string::find_last_of((char *)psVar1,0x17325c,0xffffffffffffffff);
    uVar5 = (this->path)._M_string_length;
    if (uVar4 < uVar5) {
      std::__cxx11::string::find_last_of((char *)psVar1,0x17325c,0xffffffffffffffff);
      std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)psVar1);
      return __return_storage_ptr__;
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar2 = (psVar1->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)__return_storage_ptr__,pcVar2,pcVar2 + uVar5);
  return __return_storage_ptr__;
}

Assistant:

std::string ObjectFile::getFilename() const
{
	if ((path.find_last_of(OS_PATHSEP) != std::string::npos) &&
	    (path.find_last_of(OS_PATHSEP) < path.size()))
	{
		return path.substr(path.find_last_of(OS_PATHSEP) + 1);
	}
	else
	{
		return path;
	}
}